

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

_variable_type
gl4cts::Utils::getPostMatrixMultiplicationVariableType
          (_variable_type type_matrix_a,_variable_type type_matrix_b)

{
  uint uVar1;
  uint uVar2;
  TestError *pTVar3;
  _variable_type local_2c;
  _variable_type result;
  uint n_result_rows;
  uint n_result_columns;
  uint n_b_columns;
  uint n_a_rows;
  uint n_a_components;
  uint n_a_columns;
  _variable_type type_matrix_b_local;
  _variable_type type_matrix_a_local;
  
  uVar1 = getNumberOfColumnsForVariableType(type_matrix_a);
  uVar2 = getNumberOfComponentsForVariableType(type_matrix_a);
  uVar2 = uVar2 / uVar1;
  uVar1 = getNumberOfColumnsForVariableType(type_matrix_b);
  if (uVar1 == 2) {
    if (uVar2 == 2) {
      local_2c = VARIABLE_TYPE_DMAT2;
    }
    else if (uVar2 == 3) {
      local_2c = VARIABLE_TYPE_DMAT2X3;
    }
    else {
      if (uVar2 != 4) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized amount of rows in result variable",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x482);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_2c = VARIABLE_TYPE_DMAT2X4;
    }
  }
  else if (uVar1 == 3) {
    if (uVar2 == 2) {
      local_2c = VARIABLE_TYPE_DMAT3X2;
    }
    else if (uVar2 == 3) {
      local_2c = VARIABLE_TYPE_DMAT3;
    }
    else {
      if (uVar2 != 4) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized amount of rows in result variable",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x499);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_2c = VARIABLE_TYPE_DMAT3X4;
    }
  }
  else {
    if (uVar1 != 4) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Unrecognized amount of columns in result variable",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x4b9);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (uVar2 == 2) {
      local_2c = VARIABLE_TYPE_DMAT4X2;
    }
    else if (uVar2 == 3) {
      local_2c = VARIABLE_TYPE_DMAT4X3;
    }
    else {
      if (uVar2 != 4) {
        pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar3,"Unrecognized amount of rows in result variable",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                   ,0x4b0);
        __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_2c = VARIABLE_TYPE_DMAT4;
    }
  }
  return local_2c;
}

Assistant:

Utils::_variable_type Utils::getPostMatrixMultiplicationVariableType(_variable_type type_matrix_a,
																	 _variable_type type_matrix_b)
{
	const unsigned int	n_a_columns	  = Utils::getNumberOfColumnsForVariableType(type_matrix_a);
	const unsigned int	n_a_components   = Utils::getNumberOfComponentsForVariableType(type_matrix_a);
	const unsigned int	n_a_rows		   = n_a_components / n_a_columns;
	const unsigned int	n_b_columns	  = Utils::getNumberOfColumnsForVariableType(type_matrix_b);
	const unsigned int	n_result_columns = n_b_columns;
	const unsigned int	n_result_rows	= n_a_rows;
	Utils::_variable_type result;

	switch (n_result_columns)
	{
	case 2:
	{
		switch (n_result_rows)
		{
		case 2:
			result = VARIABLE_TYPE_DMAT2;
			break;
		case 3:
			result = VARIABLE_TYPE_DMAT2X3;
			break;
		case 4:
			result = VARIABLE_TYPE_DMAT2X4;
			break;

		default:
		{
			TCU_FAIL("Unrecognized amount of rows in result variable");
		}
		} /* switch (n_result_rows) */

		break;
	} /* case 2: */

	case 3:
	{
		switch (n_result_rows)
		{
		case 2:
			result = VARIABLE_TYPE_DMAT3X2;
			break;
		case 3:
			result = VARIABLE_TYPE_DMAT3;
			break;
		case 4:
			result = VARIABLE_TYPE_DMAT3X4;
			break;

		default:
		{
			TCU_FAIL("Unrecognized amount of rows in result variable");
		}
		} /* switch (n_result_rows) */

		break;
	} /* case 3: */

	case 4:
	{
		switch (n_result_rows)
		{
		case 2:
			result = VARIABLE_TYPE_DMAT4X2;
			break;
		case 3:
			result = VARIABLE_TYPE_DMAT4X3;
			break;
		case 4:
			result = VARIABLE_TYPE_DMAT4;
			break;

		default:
		{
			TCU_FAIL("Unrecognized amount of rows in result variable");
		}
		} /* switch (n_result_rows) */

		break;
	} /* case 4: */

	default:
	{
		TCU_FAIL("Unrecognized amount of columns in result variable");
	}
	} /* switch (n_result_columns) */

	/* Done */
	return result;
}